

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *pcVar1;
  size_t sVar2;
  lock_guard<std::mutex> lock;
  char *pcVar3;
  string_view title;
  string_view title_00;
  string_view title_01;
  char local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string msg;
  string_view message_local;
  char *local_38;
  
  pcVar3 = message._M_str;
  sVar2 = message._M_len;
  local_c9 = '\n';
  pcVar1 = pcVar3;
  message_local._M_len = sVar2;
  message_local._M_str = pcVar3;
  local_88._0_16_ = cmQtAutoGen::GeneratorName(genType);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[18]>
            (&local_a8,(basic_string_view<char,_std::char_traits<char>_> *)&local_88,
             (char (*) [18])" subprocess error");
  title._M_str = pcVar1;
  title._M_len = (size_t)local_a8._M_dataplus._M_p;
  HeadLine_abi_cxx11_(&local_c8,(Logger *)local_a8._M_string_length,title);
  if (sVar2 == 0) {
    local_38 = "\n\n";
  }
  else {
    local_38 = "\n\n";
    if (pcVar3[sVar2 - 1] == '\n') {
      local_38 = "\n";
    }
  }
  args = &message_local;
  cmStrCat<char,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>&,char_const*>
            (&msg,&local_c9,&local_c8,args,&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  title_00._M_str = (char *)args;
  title_00._M_len = (size_t)"Command";
  HeadLine_abi_cxx11_(&local_a8,(Logger *)0x7,title_00);
  cmQtAutoGen::QuotedCommand(&local_88,command);
  pcVar3 = "\n\n";
  pcVar1 = "\n\n";
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[3]>
            (&local_c8,&local_a8,&local_88,(char (*) [3])0x6ceded);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  title_01._M_str = pcVar1;
  title_01._M_len = (size_t)"Output";
  HeadLine_abi_cxx11_(&local_a8,(Logger *)&DAT_00000006,title_01);
  if ((output->_M_string_length != 0) &&
     (pcVar3 = "\n\n", (output->_M_dataplus)._M_p[output->_M_string_length - 1] == '\n')) {
    pcVar3 = "\n";
  }
  local_88._M_dataplus._M_p = pcVar3;
  cmStrCat<std::__cxx11::string,std::__cxx11::string_const&,char_const*>
            (&local_c8,&local_a8,output,(char **)&local_88);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stderr(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}